

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_File.cpp
# Opt level: O0

uint64_t axl::io::copyFile(File *srcFile,File *dstFile,uint64_t size)

{
  undefined1 auVar1 [16];
  int iVar2;
  Module *this;
  void *pvVar3;
  void *in_RDX;
  Handle *in_RSI;
  Handle *in_RDI;
  void *dst;
  void *src;
  Mapping dstMapping;
  Mapping srcMapping;
  uint64_t offset;
  size_t blockSize;
  SystemInfo *systemInfo;
  bool result;
  uint64_t in_stack_ffffffffffffff38;
  File *in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff48;
  int fd;
  uint_t in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  void *in_stack_ffffffffffffff58;
  void *addrHint;
  undefined4 in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff80;
  Mapping local_60;
  Mapping local_50;
  uint64_t local_40;
  void *local_38;
  SystemInfo *local_30;
  undefined1 local_21;
  void *local_20;
  Handle *local_18;
  Handle *local_10;
  uint64_t local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  this = g::getModule();
  local_30 = g::Module::getSystemInfo(this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_30->m_mappingAlignFactor;
  local_38 = (void *)((local_30->m_mappingAlignFactor + 0x10000) -
                     SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) % auVar1,0));
  local_40 = 0;
  if (local_20 == (void *)0xffffffffffffffff) {
    local_20 = (void *)File::getSize((File *)0x1a8752);
  }
  pvVar3 = local_20;
  local_21 = File::setSize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((bool)local_21) {
    psx::Mapping::Mapping(&local_50);
    psx::Mapping::Mapping(&local_60);
    for (; fd = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20), iVar2 = (int)pvVar3,
        local_20 != (void *)0x0; local_20 = (void *)((long)local_20 - (long)local_38)) {
      if (local_20 < local_38) {
        local_38 = local_20;
      }
      addrHint = local_38;
      iVar2 = sl::Handle::operator_cast_to_int(local_10);
      pvVar3 = psx::Mapping::map((Mapping *)CONCAT44(iVar2,in_stack_ffffffffffffff68),addrHint,
                                 (size_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                 in_stack_ffffffffffffff50,fd,(size_t)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff48 = local_38;
      in_stack_ffffffffffffff58 = pvVar3;
      in_stack_ffffffffffffff54 = sl::Handle::operator_cast_to_int(local_18);
      in_stack_ffffffffffffff80 =
           psx::Mapping::map((Mapping *)CONCAT44(iVar2,in_stack_ffffffffffffff68),addrHint,
                             (size_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                             in_stack_ffffffffffffff50,
                             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                             (size_t)in_stack_ffffffffffffff80);
      if ((pvVar3 == (void *)0x0) || (in_stack_ffffffffffffff80 == (void *)0x0)) {
        local_8 = 0xffffffffffffffff;
        goto LAB_001a8978;
      }
      __wrap_memcpy((void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff80);
      local_40 = (long)local_38 + local_40;
    }
    psx::Mapping::close(&local_50,iVar2);
    psx::Mapping::close(&local_60,iVar2);
    local_8 = local_40;
LAB_001a8978:
    psx::Mapping::~Mapping((Mapping *)0x1a8982);
    psx::Mapping::~Mapping((Mapping *)0x1a898c);
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

uint64_t
copyFile(
	const io::File* srcFile,
	io::File* dstFile,
	uint64_t size
) {
	enum {
		BaseBlockSize = 64 * 1024, // 64K
	};

	bool result;

	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	size_t blockSize = BaseBlockSize + systemInfo->m_mappingAlignFactor - BaseBlockSize % systemInfo->m_mappingAlignFactor;

	uint64_t offset = 0;

	if (size == -1)
		size = srcFile->getSize();

	result = dstFile->setSize(size);
	if (!result)
		return -1;

#if (_AXL_OS_WIN)
	win::Mapping srcMapping;
	win::Mapping dstMapping;
	win::MappedView srcView;
	win::MappedView dstView;

	result =
		srcMapping.create(srcFile->m_file, NULL, PAGE_READONLY, size) &&
		dstMapping.create(dstFile->m_file, NULL, PAGE_READWRITE, size);

	if (!result)
		return -1;

	while (size) {
		if (blockSize > size)
			blockSize = (size_t)size;

		const void* src = srcView.view(srcMapping, FILE_MAP_READ, offset, blockSize);
		void* dst = dstView.view(dstMapping, FILE_MAP_READ | FILE_MAP_WRITE, offset, blockSize);

		if (!src || !dst)
			return -1;

		memcpy(dst, src, blockSize);

		offset += blockSize;
		size -= blockSize;
	}

	srcMapping.close();
	dstMapping.close();
	srcView.close();
	dstView.close();
#else
	psx::Mapping srcMapping;
	psx::Mapping dstMapping;

	while (size) {
		if (blockSize > size)
			blockSize = (size_t)size;

		const void* src = srcMapping.map(NULL, blockSize, PROT_READ, MAP_SHARED, srcFile->m_file, offset);
		void* dst = dstMapping.map(NULL, blockSize, PROT_READ | PROT_WRITE, MAP_SHARED, dstFile->m_file, offset);

		if (!src || !dst)
			return -1;

		memcpy(dst, src, blockSize);

		offset += blockSize;
		size -= blockSize;
	}

	srcMapping.close();
	dstMapping.close();
#endif

	return offset;
}